

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::V1LayerParameter::MergeFrom(V1LayerParameter *this,V1LayerParameter *from)

{
  uint uVar1;
  bool bVar2;
  V1LayerParameter_LayerType value;
  LogMessage *other;
  string *default_value;
  V0LayerParameter *this_00;
  V0LayerParameter *from_00;
  ConcatParameter *this_01;
  ConcatParameter *from_01;
  ConvolutionParameter *this_02;
  ConvolutionParameter *from_02;
  DataParameter *this_03;
  DataParameter *from_03;
  DropoutParameter *this_04;
  DropoutParameter *from_04;
  HDF5DataParameter *this_05;
  HDF5DataParameter *from_05;
  HDF5OutputParameter *this_06;
  HDF5OutputParameter *from_06;
  ImageDataParameter *this_07;
  ImageDataParameter *from_07;
  InfogainLossParameter *this_08;
  InfogainLossParameter *from_08;
  InnerProductParameter *this_09;
  InnerProductParameter *from_09;
  LRNParameter *this_10;
  LRNParameter *from_10;
  PoolingParameter *this_11;
  PoolingParameter *from_11;
  WindowDataParameter *this_12;
  WindowDataParameter *from_12;
  PowerParameter *this_13;
  PowerParameter *from_13;
  MemoryDataParameter *this_14;
  MemoryDataParameter *from_14;
  ArgMaxParameter *this_15;
  ArgMaxParameter *from_15;
  EltwiseParameter *this_16;
  EltwiseParameter *from_16;
  ThresholdParameter *this_17;
  ThresholdParameter *from_17;
  DummyDataParameter *this_18;
  DummyDataParameter *from_18;
  AccuracyParameter *this_19;
  AccuracyParameter *from_19;
  HingeLossParameter *this_20;
  HingeLossParameter *from_20;
  ReLUParameter *this_21;
  ReLUParameter *from_21;
  SliceParameter *this_22;
  SliceParameter *from_22;
  MVNParameter *this_23;
  MVNParameter *from_23;
  TransformationParameter *this_24;
  TransformationParameter *from_24;
  TanHParameter *this_25;
  TanHParameter *from_25;
  SigmoidParameter *this_26;
  SigmoidParameter *from_26;
  SoftmaxParameter *this_27;
  SoftmaxParameter *from_27;
  ContrastiveLossParameter *this_28;
  ContrastiveLossParameter *from_28;
  ExpParameter *this_29;
  ExpParameter *from_29;
  LossParameter *this_30;
  LossParameter *from_30;
  InternalMetadataWithArena *this_31;
  LogFinisher local_b5;
  uint32 cached_has_bits;
  byte local_a1;
  LogMessage local_a0;
  V1LayerParameter *local_68;
  V1LayerParameter *from_local;
  V1LayerParameter *this_local;
  InternalMetadataWithArena *local_50;
  InternalMetadataWithArena *local_48;
  undefined4 local_3c;
  HasBits<2UL> *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_a1 = 0;
  local_68 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0xa60c);
    local_a1 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_a0,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_b5,other);
  }
  if ((local_a1 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  this_31 = &this->_internal_metadata_;
  this_local = (V1LayerParameter *)&local_68->_internal_metadata_;
  local_50 = this_31;
  local_48 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (this_31,&local_28->unknown_fields);
  }
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->bottom_,&local_68->bottom_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->top_,&local_68->top_);
  google::protobuf::RepeatedPtrField<caffe::BlobProto>::MergeFrom(&this->blobs_,&local_68->blobs_);
  google::protobuf::RepeatedField<float>::MergeFrom(&this->blobs_lr_,&local_68->blobs_lr_);
  google::protobuf::RepeatedField<float>::MergeFrom(&this->weight_decay_,&local_68->weight_decay_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::MergeFrom
            (&this->include_,&local_68->include_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::MergeFrom
            (&this->exclude_,&local_68->exclude_);
  google::protobuf::RepeatedField<float>::MergeFrom(&this->loss_weight_,&local_68->loss_weight_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->param_,&local_68->param_);
  google::protobuf::RepeatedField<int>::MergeFrom
            (&this->blob_share_mode_,&local_68->blob_share_mode_);
  local_38 = &local_68->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      set_has_name(this);
      default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->name_,default_value,(local_68->name_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      this_00 = mutable_layer(this);
      from_00 = layer(local_68);
      V0LayerParameter::MergeFrom(this_00,from_00);
    }
    if ((uVar1 & 4) != 0) {
      this_01 = mutable_concat_param(this);
      from_01 = concat_param(local_68);
      ConcatParameter::MergeFrom(this_01,from_01);
    }
    if ((uVar1 & 8) != 0) {
      this_02 = mutable_convolution_param(this);
      from_02 = convolution_param(local_68);
      ConvolutionParameter::MergeFrom(this_02,from_02);
    }
    if ((uVar1 & 0x10) != 0) {
      this_03 = mutable_data_param(this);
      from_03 = data_param(local_68);
      DataParameter::MergeFrom(this_03,from_03);
    }
    if ((uVar1 & 0x20) != 0) {
      this_04 = mutable_dropout_param(this);
      from_04 = dropout_param(local_68);
      DropoutParameter::MergeFrom(this_04,from_04);
    }
    if ((uVar1 & 0x40) != 0) {
      this_05 = mutable_hdf5_data_param(this);
      from_05 = hdf5_data_param(local_68);
      HDF5DataParameter::MergeFrom(this_05,from_05);
    }
    if ((uVar1 & 0x80) != 0) {
      this_06 = mutable_hdf5_output_param(this);
      from_06 = hdf5_output_param(local_68);
      HDF5OutputParameter::MergeFrom(this_06,from_06);
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      this_07 = mutable_image_data_param(this);
      from_07 = image_data_param(local_68);
      ImageDataParameter::MergeFrom(this_07,from_07);
    }
    if ((uVar1 & 0x200) != 0) {
      this_08 = mutable_infogain_loss_param(this);
      from_08 = infogain_loss_param(local_68);
      InfogainLossParameter::MergeFrom(this_08,from_08);
    }
    if ((uVar1 & 0x400) != 0) {
      this_09 = mutable_inner_product_param(this);
      from_09 = inner_product_param(local_68);
      InnerProductParameter::MergeFrom(this_09,from_09);
    }
    if ((uVar1 & 0x800) != 0) {
      this_10 = mutable_lrn_param(this);
      from_10 = lrn_param(local_68);
      LRNParameter::MergeFrom(this_10,from_10);
    }
    if ((uVar1 & 0x1000) != 0) {
      this_11 = mutable_pooling_param(this);
      from_11 = pooling_param(local_68);
      PoolingParameter::MergeFrom(this_11,from_11);
    }
    if ((uVar1 & 0x2000) != 0) {
      this_12 = mutable_window_data_param(this);
      from_12 = window_data_param(local_68);
      WindowDataParameter::MergeFrom(this_12,from_12);
    }
    if ((uVar1 & 0x4000) != 0) {
      this_13 = mutable_power_param(this);
      from_13 = power_param(local_68);
      PowerParameter::MergeFrom(this_13,from_13);
    }
    if ((uVar1 & 0x8000) != 0) {
      this_14 = mutable_memory_data_param(this);
      from_14 = memory_data_param(local_68);
      MemoryDataParameter::MergeFrom(this_14,from_14);
    }
  }
  if ((uVar1 & 0xff0000) != 0) {
    if ((uVar1 & 0x10000) != 0) {
      this_15 = mutable_argmax_param(this);
      from_15 = argmax_param(local_68);
      ArgMaxParameter::MergeFrom(this_15,from_15);
    }
    if ((uVar1 & 0x20000) != 0) {
      this_16 = mutable_eltwise_param(this);
      from_16 = eltwise_param(local_68);
      EltwiseParameter::MergeFrom(this_16,from_16);
    }
    if ((uVar1 & 0x40000) != 0) {
      this_17 = mutable_threshold_param(this);
      from_17 = threshold_param(local_68);
      ThresholdParameter::MergeFrom(this_17,from_17);
    }
    if ((uVar1 & 0x80000) != 0) {
      this_18 = mutable_dummy_data_param(this);
      from_18 = dummy_data_param(local_68);
      DummyDataParameter::MergeFrom(this_18,from_18);
    }
    if ((uVar1 & 0x100000) != 0) {
      this_19 = mutable_accuracy_param(this);
      from_19 = accuracy_param(local_68);
      AccuracyParameter::MergeFrom(this_19,from_19);
    }
    if ((uVar1 & 0x200000) != 0) {
      this_20 = mutable_hinge_loss_param(this);
      from_20 = hinge_loss_param(local_68);
      HingeLossParameter::MergeFrom(this_20,from_20);
    }
    if ((uVar1 & 0x400000) != 0) {
      this_21 = mutable_relu_param(this);
      from_21 = relu_param(local_68);
      ReLUParameter::MergeFrom(this_21,from_21);
    }
    if ((uVar1 & 0x800000) != 0) {
      this_22 = mutable_slice_param(this);
      from_22 = slice_param(local_68);
      SliceParameter::MergeFrom(this_22,from_22);
    }
  }
  if ((uVar1 & 0xff000000) != 0) {
    if ((uVar1 & 0x1000000) != 0) {
      this_23 = mutable_mvn_param(this);
      from_23 = mvn_param(local_68);
      MVNParameter::MergeFrom(this_23,from_23);
    }
    if ((uVar1 & 0x2000000) != 0) {
      this_24 = mutable_transform_param(this);
      from_24 = transform_param(local_68);
      TransformationParameter::MergeFrom(this_24,from_24);
    }
    if ((uVar1 & 0x4000000) != 0) {
      this_25 = mutable_tanh_param(this);
      from_25 = tanh_param(local_68);
      TanHParameter::MergeFrom(this_25,from_25);
    }
    if ((uVar1 & 0x8000000) != 0) {
      this_26 = mutable_sigmoid_param(this);
      from_26 = sigmoid_param(local_68);
      SigmoidParameter::MergeFrom(this_26,from_26);
    }
    if ((uVar1 & 0x10000000) != 0) {
      this_27 = mutable_softmax_param(this);
      from_27 = softmax_param(local_68);
      SoftmaxParameter::MergeFrom(this_27,from_27);
    }
    if ((uVar1 & 0x20000000) != 0) {
      this_28 = mutable_contrastive_loss_param(this);
      from_28 = contrastive_loss_param(local_68);
      ContrastiveLossParameter::MergeFrom(this_28,from_28);
    }
    if ((uVar1 & 0x40000000) != 0) {
      this_29 = mutable_exp_param(this);
      from_29 = exp_param(local_68);
      ExpParameter::MergeFrom(this_29,from_29);
    }
    if ((uVar1 & 0x80000000) != 0) {
      this_30 = mutable_loss_param(this);
      from_30 = loss_param(local_68);
      LossParameter::MergeFrom(this_30,from_30);
    }
  }
  bVar2 = has_type(local_68);
  if (bVar2) {
    value = type(local_68);
    set_type(this,value);
  }
  return;
}

Assistant:

void V1LayerParameter::MergeFrom(const V1LayerParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.V1LayerParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  bottom_.MergeFrom(from.bottom_);
  top_.MergeFrom(from.top_);
  blobs_.MergeFrom(from.blobs_);
  blobs_lr_.MergeFrom(from.blobs_lr_);
  weight_decay_.MergeFrom(from.weight_decay_);
  include_.MergeFrom(from.include_);
  exclude_.MergeFrom(from.exclude_);
  loss_weight_.MergeFrom(from.loss_weight_);
  param_.MergeFrom(from.param_);
  blob_share_mode_.MergeFrom(from.blob_share_mode_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_layer()->::caffe::V0LayerParameter::MergeFrom(from.layer());
    }
    if (cached_has_bits & 0x00000004u) {
      mutable_concat_param()->::caffe::ConcatParameter::MergeFrom(from.concat_param());
    }
    if (cached_has_bits & 0x00000008u) {
      mutable_convolution_param()->::caffe::ConvolutionParameter::MergeFrom(from.convolution_param());
    }
    if (cached_has_bits & 0x00000010u) {
      mutable_data_param()->::caffe::DataParameter::MergeFrom(from.data_param());
    }
    if (cached_has_bits & 0x00000020u) {
      mutable_dropout_param()->::caffe::DropoutParameter::MergeFrom(from.dropout_param());
    }
    if (cached_has_bits & 0x00000040u) {
      mutable_hdf5_data_param()->::caffe::HDF5DataParameter::MergeFrom(from.hdf5_data_param());
    }
    if (cached_has_bits & 0x00000080u) {
      mutable_hdf5_output_param()->::caffe::HDF5OutputParameter::MergeFrom(from.hdf5_output_param());
    }
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      mutable_image_data_param()->::caffe::ImageDataParameter::MergeFrom(from.image_data_param());
    }
    if (cached_has_bits & 0x00000200u) {
      mutable_infogain_loss_param()->::caffe::InfogainLossParameter::MergeFrom(from.infogain_loss_param());
    }
    if (cached_has_bits & 0x00000400u) {
      mutable_inner_product_param()->::caffe::InnerProductParameter::MergeFrom(from.inner_product_param());
    }
    if (cached_has_bits & 0x00000800u) {
      mutable_lrn_param()->::caffe::LRNParameter::MergeFrom(from.lrn_param());
    }
    if (cached_has_bits & 0x00001000u) {
      mutable_pooling_param()->::caffe::PoolingParameter::MergeFrom(from.pooling_param());
    }
    if (cached_has_bits & 0x00002000u) {
      mutable_window_data_param()->::caffe::WindowDataParameter::MergeFrom(from.window_data_param());
    }
    if (cached_has_bits & 0x00004000u) {
      mutable_power_param()->::caffe::PowerParameter::MergeFrom(from.power_param());
    }
    if (cached_has_bits & 0x00008000u) {
      mutable_memory_data_param()->::caffe::MemoryDataParameter::MergeFrom(from.memory_data_param());
    }
  }
  if (cached_has_bits & 16711680u) {
    if (cached_has_bits & 0x00010000u) {
      mutable_argmax_param()->::caffe::ArgMaxParameter::MergeFrom(from.argmax_param());
    }
    if (cached_has_bits & 0x00020000u) {
      mutable_eltwise_param()->::caffe::EltwiseParameter::MergeFrom(from.eltwise_param());
    }
    if (cached_has_bits & 0x00040000u) {
      mutable_threshold_param()->::caffe::ThresholdParameter::MergeFrom(from.threshold_param());
    }
    if (cached_has_bits & 0x00080000u) {
      mutable_dummy_data_param()->::caffe::DummyDataParameter::MergeFrom(from.dummy_data_param());
    }
    if (cached_has_bits & 0x00100000u) {
      mutable_accuracy_param()->::caffe::AccuracyParameter::MergeFrom(from.accuracy_param());
    }
    if (cached_has_bits & 0x00200000u) {
      mutable_hinge_loss_param()->::caffe::HingeLossParameter::MergeFrom(from.hinge_loss_param());
    }
    if (cached_has_bits & 0x00400000u) {
      mutable_relu_param()->::caffe::ReLUParameter::MergeFrom(from.relu_param());
    }
    if (cached_has_bits & 0x00800000u) {
      mutable_slice_param()->::caffe::SliceParameter::MergeFrom(from.slice_param());
    }
  }
  if (cached_has_bits & 4278190080u) {
    if (cached_has_bits & 0x01000000u) {
      mutable_mvn_param()->::caffe::MVNParameter::MergeFrom(from.mvn_param());
    }
    if (cached_has_bits & 0x02000000u) {
      mutable_transform_param()->::caffe::TransformationParameter::MergeFrom(from.transform_param());
    }
    if (cached_has_bits & 0x04000000u) {
      mutable_tanh_param()->::caffe::TanHParameter::MergeFrom(from.tanh_param());
    }
    if (cached_has_bits & 0x08000000u) {
      mutable_sigmoid_param()->::caffe::SigmoidParameter::MergeFrom(from.sigmoid_param());
    }
    if (cached_has_bits & 0x10000000u) {
      mutable_softmax_param()->::caffe::SoftmaxParameter::MergeFrom(from.softmax_param());
    }
    if (cached_has_bits & 0x20000000u) {
      mutable_contrastive_loss_param()->::caffe::ContrastiveLossParameter::MergeFrom(from.contrastive_loss_param());
    }
    if (cached_has_bits & 0x40000000u) {
      mutable_exp_param()->::caffe::ExpParameter::MergeFrom(from.exp_param());
    }
    if (cached_has_bits & 0x80000000u) {
      mutable_loss_param()->::caffe::LossParameter::MergeFrom(from.loss_param());
    }
  }
  if (from.has_type()) {
    set_type(from.type());
  }
}